

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_fast.c
# Opt level: O3

size_t ZSTD_compressBlock_fast_dictMatchState
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  long *plVar1;
  ulong *iEnd;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  BYTE *pBVar6;
  ZSTD_matchState_t *pZVar7;
  ulong *mEnd;
  BYTE *pBVar8;
  U32 *pUVar9;
  U32 *pUVar10;
  long lVar11;
  U32 UVar12;
  uint uVar13;
  BYTE *op;
  size_t sVar14;
  ulong *puVar15;
  byte bVar16;
  uint uVar17;
  uint uVar18;
  ulong uVar19;
  ulong *puVar20;
  uint uVar21;
  BYTE *pBVar22;
  seqDef *psVar23;
  U32 UVar24;
  long *plVar25;
  long *plVar26;
  BYTE *ip;
  int iVar27;
  BYTE *iStart;
  long *plVar28;
  int *piVar29;
  ulong uVar30;
  ulong uVar31;
  ulong *puVar32;
  long lVar33;
  U32 UVar34;
  ulong uVar35;
  U32 UVar36;
  U32 UVar37;
  BYTE *pBVar38;
  U32 dictIndexDelta;
  BYTE *iend;
  U32 prefixStartIndex;
  BYTE *base;
  BYTE *ilimit;
  BYTE *prefixStart;
  BYTE *dictBase;
  BYTE *dictEnd;
  U32 *hashTable;
  BYTE *dictStart;
  U32 *dictHashTable;
  U32 dictStartIndex;
  
  pBVar6 = (ms->window).base;
  uVar2 = (ms->window).dictLimit;
  iStart = pBVar6 + uVar2;
  pZVar7 = ms->dictMatchState;
  uVar3 = (pZVar7->window).dictLimit;
  mEnd = (ulong *)(pZVar7->window).nextSrc;
  pBVar8 = (pZVar7->window).base;
  pBVar38 = pBVar8 + uVar3;
  uVar17 = ((int)pBVar8 - (int)mEnd) + uVar2;
  iEnd = (ulong *)((long)src + srcSize);
  plVar1 = (long *)((long)src + (srcSize - 8));
  plVar25 = (long *)((ulong)(((int)src - (int)iStart) + (int)mEnd == (int)pBVar38) + (long)src);
  uVar4 = (ms->cParams).minMatch;
  pUVar9 = ms->hashTable;
  UVar36 = *rep;
  UVar37 = rep[1];
  pUVar10 = pZVar7->hashTable;
  iVar27 = (int)pBVar6;
  if (uVar4 == 5) {
    if (plVar25 < plVar1) {
      uVar4 = (ms->cParams).targetLength;
      bVar16 = 0x40 - (char)(ms->cParams).hashLog;
      uVar5 = (pZVar7->cParams).hashLog;
      do {
        lVar33 = *plVar25;
        uVar30 = (ulong)(lVar33 * -0x30e4432345000000) >> (bVar16 & 0x3f);
        uVar35 = (long)plVar25 - (long)pBVar6;
        UVar34 = (U32)uVar35;
        uVar18 = (UVar34 - UVar36) + 1;
        piVar29 = (int *)(pBVar6 + uVar18);
        if (uVar18 < uVar2) {
          piVar29 = (int *)(pBVar8 + (uVar18 - uVar17));
        }
        uVar13 = pUVar9[uVar30];
        uVar19 = (ulong)uVar13;
        pUVar9[uVar30] = UVar34;
        if ((uVar18 - uVar2 < 0xfffffffd) && (*piVar29 == *(int *)((long)plVar25 + 1))) {
          plVar26 = (long *)((long)plVar25 + 1);
          puVar20 = iEnd;
          if (uVar18 < uVar2) {
            puVar20 = mEnd;
          }
          sVar14 = ZSTD_count_2segments
                             ((BYTE *)((long)plVar25 + 5),(BYTE *)(piVar29 + 1),(BYTE *)iEnd,
                              (BYTE *)puVar20,iStart);
          uVar30 = (long)plVar26 - (long)src;
          plVar28 = (long *)seqStore->lit;
          plVar25 = (long *)((long)plVar28 + uVar30);
          do {
            *plVar28 = *src;
            plVar28 = plVar28 + 1;
            src = (void *)((long)src + 8);
          } while (plVar28 < plVar25);
          seqStore->lit = seqStore->lit + uVar30;
          if (uVar30 < 0x10000) {
            psVar23 = seqStore->sequences;
          }
          else {
            seqStore->longLengthID = 1;
            psVar23 = seqStore->sequences;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar23 - (long)seqStore->sequencesStart) >> 3);
          }
          lVar33 = sVar14 + 4;
          uVar19 = sVar14 + 1;
          psVar23->litLength = (U16)uVar30;
          psVar23->offset = 1;
          UVar24 = UVar36;
joined_r0x004dac19:
          if (0xffff < uVar19) {
            seqStore->longLengthID = 2;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar23 - (long)seqStore->sequencesStart) >> 3);
          }
          plVar25 = (long *)(lVar33 + (long)plVar26);
          psVar23->matchLength = (U16)uVar19;
          seqStore->sequences = psVar23 + 1;
          src = plVar25;
          UVar36 = UVar24;
          if (plVar25 <= plVar1) {
            pUVar9[(ulong)(*(long *)(pBVar6 + (uVar35 & 0xffffffff) + 2) * -0x30e4432345000000) >>
                   (bVar16 & 0x3f)] = UVar34 + 2;
            pUVar9[(ulong)(*(long *)((long)plVar25 + -2) * -0x30e4432345000000) >> (bVar16 & 0x3f)]
                 = ((int)plVar25 + -2) - iVar27;
            UVar34 = UVar37;
            do {
              UVar12 = UVar24;
              UVar24 = (int)plVar25 - iVar27;
              uVar18 = UVar24 - UVar34;
              pBVar22 = pBVar6;
              if (uVar18 < uVar2) {
                pBVar22 = pBVar8 + -(ulong)uVar17;
              }
              src = plVar25;
              UVar36 = UVar12;
              UVar37 = UVar34;
              if ((0xfffffffc < uVar18 - uVar2) || (*(int *)(pBVar22 + uVar18) != (int)*plVar25))
              break;
              puVar20 = iEnd;
              if (uVar18 < uVar2) {
                puVar20 = mEnd;
              }
              sVar14 = ZSTD_count_2segments
                                 ((BYTE *)((long)plVar25 + 4),(BYTE *)((long)(pBVar22 + uVar18) + 4)
                                  ,(BYTE *)iEnd,(BYTE *)puVar20,iStart);
              *(long *)seqStore->lit = *plVar25;
              psVar23 = seqStore->sequences;
              psVar23->litLength = 0;
              psVar23->offset = 1;
              if (0xffff < sVar14 + 1) {
                seqStore->longLengthID = 2;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)psVar23 - (long)seqStore->sequencesStart) >> 3);
              }
              psVar23->matchLength = (U16)(sVar14 + 1);
              seqStore->sequences = psVar23 + 1;
              pUVar9[(ulong)(*plVar25 * -0x30e4432345000000) >> (bVar16 & 0x3f)] = UVar24;
              plVar25 = (long *)((long)plVar25 + sVar14 + 4);
              src = plVar25;
              UVar36 = UVar34;
              UVar37 = UVar12;
              UVar24 = UVar34;
              UVar34 = UVar12;
            } while (plVar25 <= plVar1);
          }
        }
        else {
          plVar26 = plVar25;
          if (uVar13 <= uVar2) {
            uVar18 = pUVar10[(ulong)(lVar33 * -0x30e4432345000000) >> (0x40U - (char)uVar5 & 0x3f)];
            if ((uVar18 <= uVar3) || (*(int *)(pBVar8 + uVar18) != (int)*plVar25))
            goto LAB_004daaa6;
            sVar14 = ZSTD_count_2segments
                               ((BYTE *)((long)plVar25 + 4),(BYTE *)((long)(pBVar8 + uVar18) + 4),
                                (BYTE *)iEnd,(BYTE *)mEnd,iStart);
            lVar33 = sVar14 + 4;
            if (src < plVar25) {
              pBVar22 = pBVar8 + ((ulong)uVar18 - 1);
              do {
                plVar28 = (long *)((long)plVar25 + -1);
                plVar26 = plVar25;
                if ((*(BYTE *)plVar28 != *pBVar22) ||
                   (lVar33 = lVar33 + 1, plVar26 = plVar28, pBVar22 <= pBVar38)) break;
                pBVar22 = pBVar22 + -1;
                plVar25 = plVar28;
              } while (src < plVar28);
            }
            UVar24 = UVar34 - (uVar18 + uVar17);
            uVar30 = (long)plVar26 - (long)src;
            plVar28 = (long *)seqStore->lit;
            plVar25 = (long *)((long)plVar28 + uVar30);
            do {
              *plVar28 = *src;
              plVar28 = plVar28 + 1;
              src = (void *)((long)src + 8);
            } while (plVar28 < plVar25);
            seqStore->lit = seqStore->lit + uVar30;
            if (uVar30 < 0x10000) {
              psVar23 = seqStore->sequences;
            }
            else {
              seqStore->longLengthID = 1;
              psVar23 = seqStore->sequences;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)psVar23 - (long)seqStore->sequencesStart) >> 3);
            }
            uVar19 = lVar33 - 3;
            psVar23->litLength = (U16)uVar30;
            psVar23->offset = UVar24 + 3;
            UVar37 = UVar36;
            goto joined_r0x004dac19;
          }
          piVar29 = (int *)(pBVar6 + uVar19);
          if (*piVar29 == (int)*plVar25) {
            puVar20 = (ulong *)((long)plVar25 + 4);
            puVar32 = (ulong *)(piVar29 + 1);
            puVar15 = puVar20;
            if (puVar20 < (ulong *)((long)iEnd - 7U)) {
              if (*puVar32 == *puVar20) {
                lVar33 = 0;
                do {
                  puVar32 = (ulong *)((long)plVar25 + lVar33 + 0xc);
                  if ((ulong *)((long)iEnd - 7U) <= puVar32) {
                    puVar32 = (ulong *)(pBVar6 + lVar33 + uVar19 + 0xc);
                    puVar15 = (ulong *)((long)plVar25 + lVar33 + 0xc);
                    goto LAB_004dab16;
                  }
                  lVar11 = lVar33 + uVar19 + 0xc;
                  uVar30 = *puVar32;
                  lVar33 = lVar33 + 8;
                } while (*(ulong *)(pBVar6 + lVar11) == uVar30);
                uVar30 = uVar30 ^ *(ulong *)(pBVar6 + lVar11);
                uVar31 = 0;
                if (uVar30 != 0) {
                  for (; (uVar30 >> uVar31 & 1) == 0; uVar31 = uVar31 + 1) {
                  }
                }
                uVar30 = (uVar31 >> 3 & 0x1fffffff) + lVar33;
              }
              else {
                uVar31 = *puVar20 ^ *puVar32;
                uVar30 = 0;
                if (uVar31 != 0) {
                  for (; (uVar31 >> uVar30 & 1) == 0; uVar30 = uVar30 + 1) {
                  }
                }
                uVar30 = uVar30 >> 3 & 0x1fffffff;
              }
            }
            else {
LAB_004dab16:
              if ((puVar15 < (ulong *)((long)iEnd - 3U)) && ((int)*puVar32 == (int)*puVar15)) {
                puVar15 = (ulong *)((long)puVar15 + 4);
                puVar32 = (ulong *)((long)puVar32 + 4);
              }
              if ((puVar15 < (ulong *)((long)iEnd + -1)) && ((short)*puVar32 == (short)*puVar15)) {
                puVar15 = (ulong *)((long)puVar15 + 2);
                puVar32 = (ulong *)((long)puVar32 + 2);
              }
              if (puVar15 < iEnd) {
                puVar15 = (ulong *)((long)puVar15 + (ulong)((BYTE)*puVar32 == (BYTE)*puVar15));
              }
              uVar30 = (long)puVar15 - (long)puVar20;
            }
            lVar33 = uVar30 + 4;
            if (src < plVar25) {
              pBVar22 = pBVar6 + (uVar19 - 1);
              do {
                plVar28 = (long *)((long)plVar26 + -1);
                if ((*(BYTE *)plVar28 != *pBVar22) ||
                   (lVar33 = lVar33 + 1, plVar26 = plVar28, pBVar22 <= iStart)) break;
                pBVar22 = pBVar22 + -1;
              } while (src < plVar28);
            }
            UVar24 = (int)plVar25 - (int)piVar29;
            uVar30 = (long)plVar26 - (long)src;
            plVar28 = (long *)seqStore->lit;
            plVar25 = (long *)((long)plVar28 + uVar30);
            do {
              *plVar28 = *src;
              plVar28 = plVar28 + 1;
              src = (void *)((long)src + 8);
            } while (plVar28 < plVar25);
            seqStore->lit = seqStore->lit + uVar30;
            if (uVar30 < 0x10000) {
              psVar23 = seqStore->sequences;
            }
            else {
              seqStore->longLengthID = 1;
              psVar23 = seqStore->sequences;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)psVar23 - (long)seqStore->sequencesStart) >> 3);
            }
            uVar19 = lVar33 - 3;
            psVar23->litLength = (U16)uVar30;
            psVar23->offset = UVar24 + 3;
            UVar37 = UVar36;
            goto joined_r0x004dac19;
          }
LAB_004daaa6:
          plVar25 = (long *)((long)plVar25 +
                            ((long)plVar25 - (long)src >> 8) + (ulong)(uVar4 + (uVar4 == 0)));
        }
      } while (plVar25 < plVar1);
    }
  }
  else if (uVar4 == 6) {
    if (plVar25 < plVar1) {
      uVar4 = (ms->cParams).targetLength;
      bVar16 = 0x40 - (char)(ms->cParams).hashLog;
      uVar5 = (pZVar7->cParams).hashLog;
      do {
        lVar33 = *plVar25;
        uVar30 = (ulong)(lVar33 * -0x30e4432340650000) >> (bVar16 & 0x3f);
        uVar35 = (long)plVar25 - (long)pBVar6;
        UVar34 = (U32)uVar35;
        uVar18 = (UVar34 - UVar36) + 1;
        piVar29 = (int *)(pBVar6 + uVar18);
        if (uVar18 < uVar2) {
          piVar29 = (int *)(pBVar8 + (uVar18 - uVar17));
        }
        uVar13 = pUVar9[uVar30];
        uVar19 = (ulong)uVar13;
        pUVar9[uVar30] = UVar34;
        if ((uVar18 - uVar2 < 0xfffffffd) && (*piVar29 == *(int *)((long)plVar25 + 1))) {
          plVar26 = (long *)((long)plVar25 + 1);
          puVar20 = iEnd;
          if (uVar18 < uVar2) {
            puVar20 = mEnd;
          }
          sVar14 = ZSTD_count_2segments
                             ((BYTE *)((long)plVar25 + 5),(BYTE *)(piVar29 + 1),(BYTE *)iEnd,
                              (BYTE *)puVar20,iStart);
          uVar30 = (long)plVar26 - (long)src;
          plVar28 = (long *)seqStore->lit;
          plVar25 = (long *)((long)plVar28 + uVar30);
          do {
            *plVar28 = *src;
            plVar28 = plVar28 + 1;
            src = (void *)((long)src + 8);
          } while (plVar28 < plVar25);
          seqStore->lit = seqStore->lit + uVar30;
          if (uVar30 < 0x10000) {
            psVar23 = seqStore->sequences;
          }
          else {
            seqStore->longLengthID = 1;
            psVar23 = seqStore->sequences;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar23 - (long)seqStore->sequencesStart) >> 3);
          }
          lVar33 = sVar14 + 4;
          uVar19 = sVar14 + 1;
          psVar23->litLength = (U16)uVar30;
          psVar23->offset = 1;
          UVar24 = UVar36;
joined_r0x004da5f3:
          if (0xffff < uVar19) {
            seqStore->longLengthID = 2;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar23 - (long)seqStore->sequencesStart) >> 3);
          }
          plVar25 = (long *)(lVar33 + (long)plVar26);
          psVar23->matchLength = (U16)uVar19;
          seqStore->sequences = psVar23 + 1;
          src = plVar25;
          UVar36 = UVar24;
          if (plVar25 <= plVar1) {
            pUVar9[(ulong)(*(long *)(pBVar6 + (uVar35 & 0xffffffff) + 2) * -0x30e4432340650000) >>
                   (bVar16 & 0x3f)] = UVar34 + 2;
            pUVar9[(ulong)(*(long *)((long)plVar25 + -2) * -0x30e4432340650000) >> (bVar16 & 0x3f)]
                 = ((int)plVar25 + -2) - iVar27;
            UVar34 = UVar37;
            do {
              UVar12 = UVar24;
              UVar24 = (int)plVar25 - iVar27;
              uVar18 = UVar24 - UVar34;
              pBVar22 = pBVar6;
              if (uVar18 < uVar2) {
                pBVar22 = pBVar8 + -(ulong)uVar17;
              }
              src = plVar25;
              UVar36 = UVar12;
              UVar37 = UVar34;
              if ((0xfffffffc < uVar18 - uVar2) || (*(int *)(pBVar22 + uVar18) != (int)*plVar25))
              break;
              puVar20 = iEnd;
              if (uVar18 < uVar2) {
                puVar20 = mEnd;
              }
              sVar14 = ZSTD_count_2segments
                                 ((BYTE *)((long)plVar25 + 4),(BYTE *)((long)(pBVar22 + uVar18) + 4)
                                  ,(BYTE *)iEnd,(BYTE *)puVar20,iStart);
              *(long *)seqStore->lit = *plVar25;
              psVar23 = seqStore->sequences;
              psVar23->litLength = 0;
              psVar23->offset = 1;
              if (0xffff < sVar14 + 1) {
                seqStore->longLengthID = 2;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)psVar23 - (long)seqStore->sequencesStart) >> 3);
              }
              psVar23->matchLength = (U16)(sVar14 + 1);
              seqStore->sequences = psVar23 + 1;
              pUVar9[(ulong)(*plVar25 * -0x30e4432340650000) >> (bVar16 & 0x3f)] = UVar24;
              plVar25 = (long *)((long)plVar25 + sVar14 + 4);
              src = plVar25;
              UVar36 = UVar34;
              UVar37 = UVar12;
              UVar24 = UVar34;
              UVar34 = UVar12;
            } while (plVar25 <= plVar1);
          }
        }
        else {
          plVar26 = plVar25;
          if (uVar13 <= uVar2) {
            uVar18 = pUVar10[(ulong)(lVar33 * -0x30e4432340650000) >> (0x40U - (char)uVar5 & 0x3f)];
            if ((uVar18 <= uVar3) || (*(int *)(pBVar8 + uVar18) != (int)*plVar25))
            goto LAB_004da484;
            sVar14 = ZSTD_count_2segments
                               ((BYTE *)((long)plVar25 + 4),(BYTE *)((long)(pBVar8 + uVar18) + 4),
                                (BYTE *)iEnd,(BYTE *)mEnd,iStart);
            lVar33 = sVar14 + 4;
            if (src < plVar25) {
              pBVar22 = pBVar8 + ((ulong)uVar18 - 1);
              do {
                plVar28 = (long *)((long)plVar25 + -1);
                plVar26 = plVar25;
                if ((*(BYTE *)plVar28 != *pBVar22) ||
                   (lVar33 = lVar33 + 1, plVar26 = plVar28, pBVar22 <= pBVar38)) break;
                pBVar22 = pBVar22 + -1;
                plVar25 = plVar28;
              } while (src < plVar28);
            }
            UVar24 = UVar34 - (uVar18 + uVar17);
            uVar30 = (long)plVar26 - (long)src;
            plVar28 = (long *)seqStore->lit;
            plVar25 = (long *)((long)plVar28 + uVar30);
            do {
              *plVar28 = *src;
              plVar28 = plVar28 + 1;
              src = (void *)((long)src + 8);
            } while (plVar28 < plVar25);
            seqStore->lit = seqStore->lit + uVar30;
            if (uVar30 < 0x10000) {
              psVar23 = seqStore->sequences;
            }
            else {
              seqStore->longLengthID = 1;
              psVar23 = seqStore->sequences;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)psVar23 - (long)seqStore->sequencesStart) >> 3);
            }
            uVar19 = lVar33 - 3;
            psVar23->litLength = (U16)uVar30;
            psVar23->offset = UVar24 + 3;
            UVar37 = UVar36;
            goto joined_r0x004da5f3;
          }
          piVar29 = (int *)(pBVar6 + uVar19);
          if (*piVar29 == (int)*plVar25) {
            puVar20 = (ulong *)((long)plVar25 + 4);
            puVar32 = (ulong *)(piVar29 + 1);
            puVar15 = puVar20;
            if (puVar20 < (ulong *)((long)iEnd - 7U)) {
              if (*puVar32 == *puVar20) {
                lVar33 = 0;
                do {
                  puVar32 = (ulong *)((long)plVar25 + lVar33 + 0xc);
                  if ((ulong *)((long)iEnd - 7U) <= puVar32) {
                    puVar32 = (ulong *)(pBVar6 + lVar33 + uVar19 + 0xc);
                    puVar15 = (ulong *)((long)plVar25 + lVar33 + 0xc);
                    goto LAB_004da4f3;
                  }
                  lVar11 = lVar33 + uVar19 + 0xc;
                  uVar30 = *puVar32;
                  lVar33 = lVar33 + 8;
                } while (*(ulong *)(pBVar6 + lVar11) == uVar30);
                uVar30 = uVar30 ^ *(ulong *)(pBVar6 + lVar11);
                uVar31 = 0;
                if (uVar30 != 0) {
                  for (; (uVar30 >> uVar31 & 1) == 0; uVar31 = uVar31 + 1) {
                  }
                }
                uVar30 = (uVar31 >> 3 & 0x1fffffff) + lVar33;
              }
              else {
                uVar31 = *puVar20 ^ *puVar32;
                uVar30 = 0;
                if (uVar31 != 0) {
                  for (; (uVar31 >> uVar30 & 1) == 0; uVar30 = uVar30 + 1) {
                  }
                }
                uVar30 = uVar30 >> 3 & 0x1fffffff;
              }
            }
            else {
LAB_004da4f3:
              if ((puVar15 < (ulong *)((long)iEnd - 3U)) && ((int)*puVar32 == (int)*puVar15)) {
                puVar15 = (ulong *)((long)puVar15 + 4);
                puVar32 = (ulong *)((long)puVar32 + 4);
              }
              if ((puVar15 < (ulong *)((long)iEnd + -1)) && ((short)*puVar32 == (short)*puVar15)) {
                puVar15 = (ulong *)((long)puVar15 + 2);
                puVar32 = (ulong *)((long)puVar32 + 2);
              }
              if (puVar15 < iEnd) {
                puVar15 = (ulong *)((long)puVar15 + (ulong)((BYTE)*puVar32 == (BYTE)*puVar15));
              }
              uVar30 = (long)puVar15 - (long)puVar20;
            }
            lVar33 = uVar30 + 4;
            if (src < plVar25) {
              pBVar22 = pBVar6 + (uVar19 - 1);
              do {
                plVar28 = (long *)((long)plVar26 + -1);
                if ((*(BYTE *)plVar28 != *pBVar22) ||
                   (lVar33 = lVar33 + 1, plVar26 = plVar28, pBVar22 <= iStart)) break;
                pBVar22 = pBVar22 + -1;
              } while (src < plVar28);
            }
            UVar24 = (int)plVar25 - (int)piVar29;
            uVar30 = (long)plVar26 - (long)src;
            plVar28 = (long *)seqStore->lit;
            plVar25 = (long *)((long)plVar28 + uVar30);
            do {
              *plVar28 = *src;
              plVar28 = plVar28 + 1;
              src = (void *)((long)src + 8);
            } while (plVar28 < plVar25);
            seqStore->lit = seqStore->lit + uVar30;
            if (uVar30 < 0x10000) {
              psVar23 = seqStore->sequences;
            }
            else {
              seqStore->longLengthID = 1;
              psVar23 = seqStore->sequences;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)psVar23 - (long)seqStore->sequencesStart) >> 3);
            }
            uVar19 = lVar33 - 3;
            psVar23->litLength = (U16)uVar30;
            psVar23->offset = UVar24 + 3;
            UVar37 = UVar36;
            goto joined_r0x004da5f3;
          }
LAB_004da484:
          plVar25 = (long *)((long)plVar25 +
                            ((long)plVar25 - (long)src >> 8) + (ulong)(uVar4 + (uVar4 == 0)));
        }
      } while (plVar25 < plVar1);
    }
  }
  else if (uVar4 == 7) {
    if (plVar25 < plVar1) {
      uVar4 = (ms->cParams).targetLength;
      bVar16 = 0x40 - (char)(ms->cParams).hashLog;
      uVar5 = (pZVar7->cParams).hashLog;
      do {
        lVar33 = *plVar25;
        uVar30 = (ulong)(lVar33 * -0x30e44323405a9d00) >> (bVar16 & 0x3f);
        uVar35 = (long)plVar25 - (long)pBVar6;
        UVar34 = (U32)uVar35;
        uVar18 = (UVar34 - UVar36) + 1;
        piVar29 = (int *)(pBVar6 + uVar18);
        if (uVar18 < uVar2) {
          piVar29 = (int *)(pBVar8 + (uVar18 - uVar17));
        }
        uVar13 = pUVar9[uVar30];
        uVar19 = (ulong)uVar13;
        pUVar9[uVar30] = UVar34;
        if ((uVar18 - uVar2 < 0xfffffffd) && (*piVar29 == *(int *)((long)plVar25 + 1))) {
          plVar26 = (long *)((long)plVar25 + 1);
          puVar20 = iEnd;
          if (uVar18 < uVar2) {
            puVar20 = mEnd;
          }
          sVar14 = ZSTD_count_2segments
                             ((BYTE *)((long)plVar25 + 5),(BYTE *)(piVar29 + 1),(BYTE *)iEnd,
                              (BYTE *)puVar20,iStart);
          uVar30 = (long)plVar26 - (long)src;
          plVar28 = (long *)seqStore->lit;
          plVar25 = (long *)((long)plVar28 + uVar30);
          do {
            *plVar28 = *src;
            plVar28 = plVar28 + 1;
            src = (void *)((long)src + 8);
          } while (plVar28 < plVar25);
          seqStore->lit = seqStore->lit + uVar30;
          if (uVar30 < 0x10000) {
            psVar23 = seqStore->sequences;
          }
          else {
            seqStore->longLengthID = 1;
            psVar23 = seqStore->sequences;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar23 - (long)seqStore->sequencesStart) >> 3);
          }
          lVar33 = sVar14 + 4;
          uVar19 = sVar14 + 1;
          psVar23->litLength = (U16)uVar30;
          psVar23->offset = 1;
          UVar24 = UVar36;
joined_r0x004d9fb4:
          if (0xffff < uVar19) {
            seqStore->longLengthID = 2;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar23 - (long)seqStore->sequencesStart) >> 3);
          }
          plVar25 = (long *)(lVar33 + (long)plVar26);
          psVar23->matchLength = (U16)uVar19;
          seqStore->sequences = psVar23 + 1;
          src = plVar25;
          UVar36 = UVar24;
          if (plVar25 <= plVar1) {
            pUVar9[(ulong)(*(long *)(pBVar6 + (uVar35 & 0xffffffff) + 2) * -0x30e44323405a9d00) >>
                   (bVar16 & 0x3f)] = UVar34 + 2;
            pUVar9[(ulong)(*(long *)((long)plVar25 + -2) * -0x30e44323405a9d00) >> (bVar16 & 0x3f)]
                 = ((int)plVar25 + -2) - iVar27;
            UVar34 = UVar37;
            do {
              UVar12 = UVar24;
              UVar24 = (int)plVar25 - iVar27;
              uVar18 = UVar24 - UVar34;
              pBVar22 = pBVar6;
              if (uVar18 < uVar2) {
                pBVar22 = pBVar8 + -(ulong)uVar17;
              }
              src = plVar25;
              UVar36 = UVar12;
              UVar37 = UVar34;
              if ((0xfffffffc < uVar18 - uVar2) || (*(int *)(pBVar22 + uVar18) != (int)*plVar25))
              break;
              puVar20 = iEnd;
              if (uVar18 < uVar2) {
                puVar20 = mEnd;
              }
              sVar14 = ZSTD_count_2segments
                                 ((BYTE *)((long)plVar25 + 4),(BYTE *)((long)(pBVar22 + uVar18) + 4)
                                  ,(BYTE *)iEnd,(BYTE *)puVar20,iStart);
              *(long *)seqStore->lit = *plVar25;
              psVar23 = seqStore->sequences;
              psVar23->litLength = 0;
              psVar23->offset = 1;
              if (0xffff < sVar14 + 1) {
                seqStore->longLengthID = 2;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)psVar23 - (long)seqStore->sequencesStart) >> 3);
              }
              psVar23->matchLength = (U16)(sVar14 + 1);
              seqStore->sequences = psVar23 + 1;
              pUVar9[(ulong)(*plVar25 * -0x30e44323405a9d00) >> (bVar16 & 0x3f)] = UVar24;
              plVar25 = (long *)((long)plVar25 + sVar14 + 4);
              src = plVar25;
              UVar36 = UVar34;
              UVar37 = UVar12;
              UVar24 = UVar34;
              UVar34 = UVar12;
            } while (plVar25 <= plVar1);
          }
        }
        else {
          plVar26 = plVar25;
          if (uVar13 <= uVar2) {
            uVar18 = pUVar10[(ulong)(lVar33 * -0x30e44323405a9d00) >> (0x40U - (char)uVar5 & 0x3f)];
            if ((uVar18 <= uVar3) || (*(int *)(pBVar8 + uVar18) != (int)*plVar25))
            goto LAB_004d9e44;
            sVar14 = ZSTD_count_2segments
                               ((BYTE *)((long)plVar25 + 4),(BYTE *)((long)(pBVar8 + uVar18) + 4),
                                (BYTE *)iEnd,(BYTE *)mEnd,iStart);
            lVar33 = sVar14 + 4;
            if (src < plVar25) {
              pBVar22 = pBVar8 + ((ulong)uVar18 - 1);
              do {
                plVar28 = (long *)((long)plVar25 + -1);
                plVar26 = plVar25;
                if ((*(BYTE *)plVar28 != *pBVar22) ||
                   (lVar33 = lVar33 + 1, plVar26 = plVar28, pBVar22 <= pBVar38)) break;
                pBVar22 = pBVar22 + -1;
                plVar25 = plVar28;
              } while (src < plVar28);
            }
            UVar24 = UVar34 - (uVar18 + uVar17);
            uVar30 = (long)plVar26 - (long)src;
            plVar28 = (long *)seqStore->lit;
            plVar25 = (long *)((long)plVar28 + uVar30);
            do {
              *plVar28 = *src;
              plVar28 = plVar28 + 1;
              src = (void *)((long)src + 8);
            } while (plVar28 < plVar25);
            seqStore->lit = seqStore->lit + uVar30;
            if (uVar30 < 0x10000) {
              psVar23 = seqStore->sequences;
            }
            else {
              seqStore->longLengthID = 1;
              psVar23 = seqStore->sequences;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)psVar23 - (long)seqStore->sequencesStart) >> 3);
            }
            uVar19 = lVar33 - 3;
            psVar23->litLength = (U16)uVar30;
            psVar23->offset = UVar24 + 3;
            UVar37 = UVar36;
            goto joined_r0x004d9fb4;
          }
          piVar29 = (int *)(pBVar6 + uVar19);
          if (*piVar29 == (int)*plVar25) {
            puVar20 = (ulong *)((long)plVar25 + 4);
            puVar32 = (ulong *)(piVar29 + 1);
            puVar15 = puVar20;
            if (puVar20 < (ulong *)((long)iEnd - 7U)) {
              if (*puVar32 == *puVar20) {
                lVar33 = 0;
                do {
                  puVar32 = (ulong *)((long)plVar25 + lVar33 + 0xc);
                  if ((ulong *)((long)iEnd - 7U) <= puVar32) {
                    puVar32 = (ulong *)(pBVar6 + lVar33 + uVar19 + 0xc);
                    puVar15 = (ulong *)((long)plVar25 + lVar33 + 0xc);
                    goto LAB_004d9eb4;
                  }
                  lVar11 = lVar33 + uVar19 + 0xc;
                  uVar30 = *puVar32;
                  lVar33 = lVar33 + 8;
                } while (*(ulong *)(pBVar6 + lVar11) == uVar30);
                uVar30 = uVar30 ^ *(ulong *)(pBVar6 + lVar11);
                uVar31 = 0;
                if (uVar30 != 0) {
                  for (; (uVar30 >> uVar31 & 1) == 0; uVar31 = uVar31 + 1) {
                  }
                }
                uVar30 = (uVar31 >> 3 & 0x1fffffff) + lVar33;
              }
              else {
                uVar31 = *puVar20 ^ *puVar32;
                uVar30 = 0;
                if (uVar31 != 0) {
                  for (; (uVar31 >> uVar30 & 1) == 0; uVar30 = uVar30 + 1) {
                  }
                }
                uVar30 = uVar30 >> 3 & 0x1fffffff;
              }
            }
            else {
LAB_004d9eb4:
              if ((puVar15 < (ulong *)((long)iEnd - 3U)) && ((int)*puVar32 == (int)*puVar15)) {
                puVar15 = (ulong *)((long)puVar15 + 4);
                puVar32 = (ulong *)((long)puVar32 + 4);
              }
              if ((puVar15 < (ulong *)((long)iEnd + -1)) && ((short)*puVar32 == (short)*puVar15)) {
                puVar15 = (ulong *)((long)puVar15 + 2);
                puVar32 = (ulong *)((long)puVar32 + 2);
              }
              if (puVar15 < iEnd) {
                puVar15 = (ulong *)((long)puVar15 + (ulong)((BYTE)*puVar32 == (BYTE)*puVar15));
              }
              uVar30 = (long)puVar15 - (long)puVar20;
            }
            lVar33 = uVar30 + 4;
            if (src < plVar25) {
              pBVar22 = pBVar6 + (uVar19 - 1);
              do {
                plVar28 = (long *)((long)plVar26 + -1);
                if ((*(BYTE *)plVar28 != *pBVar22) ||
                   (lVar33 = lVar33 + 1, plVar26 = plVar28, pBVar22 <= iStart)) break;
                pBVar22 = pBVar22 + -1;
              } while (src < plVar28);
            }
            UVar24 = (int)plVar25 - (int)piVar29;
            uVar30 = (long)plVar26 - (long)src;
            plVar28 = (long *)seqStore->lit;
            plVar25 = (long *)((long)plVar28 + uVar30);
            do {
              *plVar28 = *src;
              plVar28 = plVar28 + 1;
              src = (void *)((long)src + 8);
            } while (plVar28 < plVar25);
            seqStore->lit = seqStore->lit + uVar30;
            if (uVar30 < 0x10000) {
              psVar23 = seqStore->sequences;
            }
            else {
              seqStore->longLengthID = 1;
              psVar23 = seqStore->sequences;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)psVar23 - (long)seqStore->sequencesStart) >> 3);
            }
            uVar19 = lVar33 - 3;
            psVar23->litLength = (U16)uVar30;
            psVar23->offset = UVar24 + 3;
            UVar37 = UVar36;
            goto joined_r0x004d9fb4;
          }
LAB_004d9e44:
          plVar25 = (long *)((long)plVar25 +
                            ((long)plVar25 - (long)src >> 8) + (ulong)(uVar4 + (uVar4 == 0)));
        }
      } while (plVar25 < plVar1);
    }
  }
  else if (plVar25 < plVar1) {
    uVar4 = (ms->cParams).targetLength;
    bVar16 = 0x20 - (char)(ms->cParams).hashLog;
    uVar5 = (pZVar7->cParams).hashLog;
    do {
      uVar21 = (uint)((int)*plVar25 * -0x61c8864f) >> (bVar16 & 0x1f);
      uVar35 = (long)plVar25 - (long)pBVar6;
      uVar18 = pUVar9[uVar21];
      uVar30 = (ulong)uVar18;
      UVar34 = (U32)uVar35;
      uVar13 = (UVar34 - UVar36) + 1;
      piVar29 = (int *)(pBVar6 + uVar13);
      if (uVar13 < uVar2) {
        piVar29 = (int *)(pBVar8 + (uVar13 - uVar17));
      }
      pUVar9[uVar21] = UVar34;
      if ((uVar13 - uVar2 < 0xfffffffd) && (*piVar29 == *(int *)((long)plVar25 + 1))) {
        plVar26 = (long *)((long)plVar25 + 1);
        puVar20 = iEnd;
        if (uVar13 < uVar2) {
          puVar20 = mEnd;
        }
        sVar14 = ZSTD_count_2segments
                           ((BYTE *)((long)plVar25 + 5),(BYTE *)(piVar29 + 1),(BYTE *)iEnd,
                            (BYTE *)puVar20,iStart);
        uVar30 = (long)plVar26 - (long)src;
        plVar28 = (long *)seqStore->lit;
        plVar25 = (long *)((long)plVar28 + uVar30);
        do {
          *plVar28 = *src;
          plVar28 = plVar28 + 1;
          src = (void *)((long)src + 8);
        } while (plVar28 < plVar25);
        seqStore->lit = seqStore->lit + uVar30;
        if (uVar30 < 0x10000) {
          psVar23 = seqStore->sequences;
        }
        else {
          seqStore->longLengthID = 1;
          psVar23 = seqStore->sequences;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar23 - (long)seqStore->sequencesStart) >> 3);
        }
        lVar33 = sVar14 + 4;
        uVar19 = sVar14 + 1;
        psVar23->litLength = (U16)uVar30;
        psVar23->offset = 1;
        UVar24 = UVar36;
joined_r0x004db242:
        if (0xffff < uVar19) {
          seqStore->longLengthID = 2;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar23 - (long)seqStore->sequencesStart) >> 3);
        }
        plVar25 = (long *)(lVar33 + (long)plVar26);
        psVar23->matchLength = (U16)uVar19;
        seqStore->sequences = psVar23 + 1;
        src = plVar25;
        UVar36 = UVar24;
        if (plVar25 <= plVar1) {
          pUVar9[(uint)(*(int *)(pBVar6 + (uVar35 & 0xffffffff) + 2) * -0x61c8864f) >>
                 (bVar16 & 0x1f)] = UVar34 + 2;
          pUVar9[(uint)(*(int *)((long)plVar25 + -2) * -0x61c8864f) >> (bVar16 & 0x1f)] =
               ((int)plVar25 + -2) - iVar27;
          UVar34 = UVar37;
          do {
            UVar12 = UVar24;
            UVar24 = (int)plVar25 - iVar27;
            uVar18 = UVar24 - UVar34;
            pBVar22 = pBVar6;
            if (uVar18 < uVar2) {
              pBVar22 = pBVar8 + -(ulong)uVar17;
            }
            src = plVar25;
            UVar36 = UVar12;
            UVar37 = UVar34;
            if ((0xfffffffc < uVar18 - uVar2) || (*(int *)(pBVar22 + uVar18) != (int)*plVar25))
            break;
            puVar20 = iEnd;
            if (uVar18 < uVar2) {
              puVar20 = mEnd;
            }
            sVar14 = ZSTD_count_2segments
                               ((BYTE *)((long)plVar25 + 4),(BYTE *)((long)(pBVar22 + uVar18) + 4),
                                (BYTE *)iEnd,(BYTE *)puVar20,iStart);
            *(long *)seqStore->lit = *plVar25;
            psVar23 = seqStore->sequences;
            psVar23->litLength = 0;
            psVar23->offset = 1;
            if (0xffff < sVar14 + 1) {
              seqStore->longLengthID = 2;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)psVar23 - (long)seqStore->sequencesStart) >> 3);
            }
            psVar23->matchLength = (U16)(sVar14 + 1);
            seqStore->sequences = psVar23 + 1;
            pUVar9[(uint)((int)*plVar25 * -0x61c8864f) >> (bVar16 & 0x1f)] = UVar24;
            plVar25 = (long *)((long)plVar25 + sVar14 + 4);
            src = plVar25;
            UVar36 = UVar34;
            UVar37 = UVar12;
            UVar24 = UVar34;
            UVar34 = UVar12;
          } while (plVar25 <= plVar1);
        }
      }
      else {
        plVar26 = plVar25;
        if (uVar18 <= uVar2) {
          uVar18 = pUVar10[(uint)((int)*plVar25 * -0x61c8864f) >> (0x20U - (char)uVar5 & 0x1f)];
          if ((uVar18 <= uVar3) || (*(int *)(pBVar8 + uVar18) != (int)*plVar25)) goto LAB_004db0cf;
          sVar14 = ZSTD_count_2segments
                             ((BYTE *)((long)plVar25 + 4),(BYTE *)((long)(pBVar8 + uVar18) + 4),
                              (BYTE *)iEnd,(BYTE *)mEnd,iStart);
          lVar33 = sVar14 + 4;
          if (src < plVar25) {
            pBVar22 = pBVar8 + ((ulong)uVar18 - 1);
            do {
              plVar28 = (long *)((long)plVar25 + -1);
              plVar26 = plVar25;
              if ((*(BYTE *)plVar28 != *pBVar22) ||
                 (lVar33 = lVar33 + 1, plVar26 = plVar28, pBVar22 <= pBVar38)) break;
              pBVar22 = pBVar22 + -1;
              plVar25 = plVar28;
            } while (src < plVar28);
          }
          UVar24 = UVar34 - (uVar18 + uVar17);
          uVar30 = (long)plVar26 - (long)src;
          plVar28 = (long *)seqStore->lit;
          plVar25 = (long *)((long)plVar28 + uVar30);
          do {
            *plVar28 = *src;
            plVar28 = plVar28 + 1;
            src = (void *)((long)src + 8);
          } while (plVar28 < plVar25);
          seqStore->lit = seqStore->lit + uVar30;
          if (uVar30 < 0x10000) {
            psVar23 = seqStore->sequences;
          }
          else {
            seqStore->longLengthID = 1;
            psVar23 = seqStore->sequences;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar23 - (long)seqStore->sequencesStart) >> 3);
          }
          uVar19 = lVar33 - 3;
          psVar23->litLength = (U16)uVar30;
          psVar23->offset = UVar24 + 3;
          UVar37 = UVar36;
          goto joined_r0x004db242;
        }
        piVar29 = (int *)(pBVar6 + uVar30);
        if (*piVar29 == (int)*plVar25) {
          puVar20 = (ulong *)((long)plVar25 + 4);
          puVar32 = (ulong *)(piVar29 + 1);
          puVar15 = puVar20;
          if (puVar20 < (ulong *)((long)iEnd - 7U)) {
            if (*puVar32 == *puVar20) {
              lVar33 = 0;
              do {
                puVar32 = (ulong *)((long)plVar25 + lVar33 + 0xc);
                if ((ulong *)((long)iEnd - 7U) <= puVar32) {
                  puVar32 = (ulong *)(pBVar6 + lVar33 + uVar30 + 0xc);
                  puVar15 = (ulong *)((long)plVar25 + lVar33 + 0xc);
                  goto LAB_004db13f;
                }
                lVar11 = lVar33 + uVar30 + 0xc;
                uVar19 = *puVar32;
                lVar33 = lVar33 + 8;
              } while (*(ulong *)(pBVar6 + lVar11) == uVar19);
              uVar19 = uVar19 ^ *(ulong *)(pBVar6 + lVar11);
              uVar31 = 0;
              if (uVar19 != 0) {
                for (; (uVar19 >> uVar31 & 1) == 0; uVar31 = uVar31 + 1) {
                }
              }
              uVar19 = (uVar31 >> 3 & 0x1fffffff) + lVar33;
            }
            else {
              uVar31 = *puVar20 ^ *puVar32;
              uVar19 = 0;
              if (uVar31 != 0) {
                for (; (uVar31 >> uVar19 & 1) == 0; uVar19 = uVar19 + 1) {
                }
              }
              uVar19 = uVar19 >> 3 & 0x1fffffff;
            }
          }
          else {
LAB_004db13f:
            if ((puVar15 < (ulong *)((long)iEnd - 3U)) && ((int)*puVar32 == (int)*puVar15)) {
              puVar15 = (ulong *)((long)puVar15 + 4);
              puVar32 = (ulong *)((long)puVar32 + 4);
            }
            if ((puVar15 < (ulong *)((long)iEnd + -1)) && ((short)*puVar32 == (short)*puVar15)) {
              puVar15 = (ulong *)((long)puVar15 + 2);
              puVar32 = (ulong *)((long)puVar32 + 2);
            }
            if (puVar15 < iEnd) {
              puVar15 = (ulong *)((long)puVar15 + (ulong)((BYTE)*puVar32 == (BYTE)*puVar15));
            }
            uVar19 = (long)puVar15 - (long)puVar20;
          }
          lVar33 = uVar19 + 4;
          if (src < plVar25) {
            pBVar22 = pBVar6 + (uVar30 - 1);
            do {
              plVar28 = (long *)((long)plVar26 + -1);
              if ((*(BYTE *)plVar28 != *pBVar22) ||
                 (lVar33 = lVar33 + 1, plVar26 = plVar28, pBVar22 <= iStart)) break;
              pBVar22 = pBVar22 + -1;
            } while (src < plVar28);
          }
          UVar24 = (int)plVar25 - (int)piVar29;
          uVar30 = (long)plVar26 - (long)src;
          plVar28 = (long *)seqStore->lit;
          plVar25 = (long *)((long)plVar28 + uVar30);
          do {
            *plVar28 = *src;
            plVar28 = plVar28 + 1;
            src = (void *)((long)src + 8);
          } while (plVar28 < plVar25);
          seqStore->lit = seqStore->lit + uVar30;
          if (uVar30 < 0x10000) {
            psVar23 = seqStore->sequences;
          }
          else {
            seqStore->longLengthID = 1;
            psVar23 = seqStore->sequences;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar23 - (long)seqStore->sequencesStart) >> 3);
          }
          uVar19 = lVar33 - 3;
          psVar23->litLength = (U16)uVar30;
          psVar23->offset = UVar24 + 3;
          UVar37 = UVar36;
          goto joined_r0x004db242;
        }
LAB_004db0cf:
        plVar25 = (long *)((long)plVar25 +
                          ((long)plVar25 - (long)src >> 8) + (ulong)(uVar4 + (uVar4 == 0)));
      }
    } while (plVar25 < plVar1);
  }
  *rep = UVar36;
  rep[1] = UVar37;
  return (long)iEnd - (long)src;
}

Assistant:

size_t ZSTD_compressBlock_fast_dictMatchState(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    ZSTD_compressionParameters const* cParams = &ms->cParams;
    U32 const mls = cParams->minMatch;
    assert(ms->dictMatchState != NULL);
    switch(mls)
    {
    default: /* includes case 3 */
    case 4 :
        return ZSTD_compressBlock_fast_generic(ms, seqStore, rep, src, srcSize, 4, ZSTD_dictMatchState);
    case 5 :
        return ZSTD_compressBlock_fast_generic(ms, seqStore, rep, src, srcSize, 5, ZSTD_dictMatchState);
    case 6 :
        return ZSTD_compressBlock_fast_generic(ms, seqStore, rep, src, srcSize, 6, ZSTD_dictMatchState);
    case 7 :
        return ZSTD_compressBlock_fast_generic(ms, seqStore, rep, src, srcSize, 7, ZSTD_dictMatchState);
    }
}